

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_reportRowMtx
          (HModel *this,int nrow,vector<int,_std::allocator<int>_> *XARstart,
          vector<int,_std::allocator<int>_> *XARindex,
          vector<double,_std::allocator<double>_> *XARvalue)

{
  uint uVar1;
  uint *puVar2;
  reference pvVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_R8;
  int el;
  int row;
  int local_30;
  uint local_2c;
  
  if (0 < in_ESI) {
    printf("Row    Index       Value\n");
    for (local_2c = 0; (int)local_2c < in_ESI; local_2c = local_2c + 1) {
      puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_RDX,(long)(int)local_2c);
      printf("%6d Start %8d\n",(ulong)local_2c,(ulong)*puVar2);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(int)local_2c);
      for (local_30 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_RDX,(long)(int)(local_2c + 1)), local_30 < *pvVar3;
          local_30 = local_30 + 1) {
        puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_30);
        uVar1 = *puVar2;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_30);
        printf("      %6d %11g\n",*pvVar4,(ulong)uVar1);
      }
    }
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)in_ESI);
    printf("       Start %8d\n",(ulong)*puVar2);
  }
  return;
}

Assistant:

void HModel::util_reportRowMtx(int nrow, vector<int>& XARstart, vector<int>& XARindex, vector<double>& XARvalue) {
  // Report the row-wise matrix passed to the method
  if (nrow <= 0) return;
  printf("Row    Index       Value\n");
  for (int row = 0; row < nrow; row++) {
    printf("%6d Start %8d\n", row, XARstart[row]);
    for (int el = XARstart[row]; el < XARstart[row+1]; el++) {
      printf("      %6d %11g\n", XARindex[el], XARvalue[el]);
    }
  }
    printf("       Start %8d\n", XARstart[nrow]);
}